

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.h
# Opt level: O0

char * getCondCodeName(A64CC_CondCode CC)

{
  char *pcStack_10;
  A64CC_CondCode CC_local;
  
  switch(CC) {
  case A64CC_EQ:
    pcStack_10 = "eq";
    break;
  case A64CC_NE:
    pcStack_10 = "ne";
    break;
  case A64CC_HS:
    pcStack_10 = "hs";
    break;
  case A64CC_LO:
    pcStack_10 = "lo";
    break;
  case A64CC_MI:
    pcStack_10 = "mi";
    break;
  case A64CC_PL:
    pcStack_10 = "pl";
    break;
  case A64CC_VS:
    pcStack_10 = "vs";
    break;
  case A64CC_VC:
    pcStack_10 = "vc";
    break;
  case A64CC_HI:
    pcStack_10 = "hi";
    break;
  case A64CC_LS:
    pcStack_10 = "ls";
    break;
  case A64CC_GE:
    pcStack_10 = "ge";
    break;
  case A64CC_LT:
    pcStack_10 = "lt";
    break;
  case A64CC_GT:
    pcStack_10 = "gt";
    break;
  case A64CC_LE:
    pcStack_10 = "le";
    break;
  case A64CC_AL:
    pcStack_10 = "al";
    break;
  case A64CC_NV:
    pcStack_10 = "nv";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

inline static char *getCondCodeName(A64CC_CondCode CC)
{
	switch (CC) {
		default: return NULL;	// never reach
		case A64CC_EQ:  return "eq";
		case A64CC_NE:  return "ne";
		case A64CC_HS:  return "hs";
		case A64CC_LO:  return "lo";
		case A64CC_MI:  return "mi";
		case A64CC_PL:  return "pl";
		case A64CC_VS:  return "vs";
		case A64CC_VC:  return "vc";
		case A64CC_HI:  return "hi";
		case A64CC_LS:  return "ls";
		case A64CC_GE:  return "ge";
		case A64CC_LT:  return "lt";
		case A64CC_GT:  return "gt";
		case A64CC_LE:  return "le";
		case A64CC_AL:  return "al";
		case A64CC_NV:  return "nv";
	}
}